

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_privkey.cc
# Opt level: O0

ssl_private_key_result_t
bssl::ssl_private_key_sign
          (SSL_HANDSHAKE *hs,uint8_t *out,size_t *out_len,size_t max_out,uint16_t sigalg,
          Span<const_unsigned_char> in)

{
  SSL *ssl_00;
  SSL_PRIVATE_KEY_METHOD *pSVar1;
  _func_ssl_private_key_result_t_SSL_ptr_uint8_t_ptr_size_t_ptr_size_t_uint16_t_uint8_t_ptr_size_t
  *p_Var2;
  Span<const_unsigned_char> lhs;
  bool bVar3;
  bool bVar4;
  int iVar5;
  pointer psVar6;
  pointer pSVar7;
  cbb_st *pcVar8;
  pointer peVar9;
  uchar *puVar10;
  size_t sVar11;
  env_md_ctx_st *peVar12;
  byte local_25e;
  Span<unsigned_char> local_168;
  Span<const_unsigned_char> local_158;
  uchar *local_148;
  size_t sStack_140;
  undefined1 local_130 [8];
  ScopedEVP_MD_CTX ctx;
  ssl_private_key_result_t ret;
  EVP_PKEY *privkey;
  SSL_PRIVATE_KEY_METHOD *key_method;
  Span<unsigned_char> local_e8;
  Span<const_unsigned_char> local_d8;
  Span<const_unsigned_char> local_c8;
  uchar *local_b8;
  size_t sStack_b0;
  int local_a0;
  undefined1 local_90 [8];
  ScopedCBB spki_cbb;
  Array<unsigned_char> spki;
  SSL_HANDSHAKE_HINTS *hints;
  SSL_CREDENTIAL *cred;
  SSL *ssl;
  uint16_t sigalg_local;
  size_t max_out_local;
  size_t *out_len_local;
  uint8_t *out_local;
  SSL_HANDSHAKE *hs_local;
  
  ssl_00 = hs->ssl;
  psVar6 = std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::get(&hs->credential);
  pSVar7 = std::unique_ptr<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>::get(&hs->hints);
  Array<unsigned_char>::Array((Array<unsigned_char> *)((long)&spki_cbb.ctx_.u + 0x18));
  if (pSVar7 != (pointer)0x0) {
    internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated
              ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_90);
    pcVar8 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                       ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_90);
    iVar5 = CBB_init(pcVar8,0x40);
    if (iVar5 == 0) {
LAB_001b7119:
      ssl_send_alert(ssl_00,2,0x50);
      hs_local._4_4_ = ssl_private_key_failure;
      local_a0 = 1;
    }
    else {
      pcVar8 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                         ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_90);
      peVar9 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get(&psVar6->pubkey);
      iVar5 = EVP_marshal_public_key(pcVar8,peVar9);
      if (iVar5 == 0) goto LAB_001b7119;
      pcVar8 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                         ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_90);
      bVar3 = CBBFinishArray(pcVar8,(Array<unsigned_char> *)((long)&spki_cbb.ctx_.u + 0x18));
      if (!bVar3) goto LAB_001b7119;
      local_a0 = 0;
    }
    internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
              ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_90);
    if (local_a0 != 0) goto LAB_001b7853;
  }
  bVar3 = false;
  if (((pSVar7 != (pointer)0x0) && (bVar3 = false, (*(uint *)&hs->field_0x6c8 >> 0x14 & 1) == 0)) &&
     (bVar3 = false, sigalg == pSVar7->signature_algorithm)) {
    local_b8 = in.data_;
    sStack_b0 = in.size_;
    Span<unsigned_char_const>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
              ((Span<unsigned_char_const> *)&local_c8,&pSVar7->signature_input);
    lhs.size_ = sStack_b0;
    lhs.data_ = local_b8;
    bVar4 = internal::operator==(lhs,local_c8);
    bVar3 = false;
    if (bVar4) {
      Span<unsigned_char>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
                (&local_e8,(Array<unsigned_char> *)((long)&spki_cbb.ctx_.u + 0x18));
      Span<unsigned_char_const>::Span<bssl::Span<unsigned_char>,void,bssl::Span<unsigned_char>>
                ((Span<unsigned_char_const> *)&local_d8,&local_e8);
      Span<unsigned_char_const>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
                ((Span<unsigned_char_const> *)&key_method,&pSVar7->signature_spki);
      bVar4 = internal::operator==(local_d8,_key_method);
      bVar3 = false;
      if (bVar4) {
        bVar4 = Array<unsigned_char>::empty(&pSVar7->signature);
        bVar3 = false;
        if (!bVar4) {
          sVar11 = Array<unsigned_char>::size(&pSVar7->signature);
          bVar3 = sVar11 <= max_out;
        }
      }
    }
  }
  if (bVar3) {
    sVar11 = Array<unsigned_char>::size(&pSVar7->signature);
    *out_len = sVar11;
    puVar10 = Array<unsigned_char>::data(&pSVar7->signature);
    sVar11 = Array<unsigned_char>::size(&pSVar7->signature);
    ::OPENSSL_memcpy(out,puVar10,sVar11);
    hs_local._4_4_ = ssl_private_key_success;
    local_a0 = 1;
    goto LAB_001b7853;
  }
  pSVar1 = psVar6->key_method;
  peVar9 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get(&psVar6->privkey);
  if ((((byte)(*(uint *)&hs->field_0x6c8 >> 0x17) & 1 ^ 0xff) & 1) == 0) {
    __assert_fail("!hs->can_release_private_key",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_privkey.cc"
                  ,0xe4,
                  "enum ssl_private_key_result_t bssl::ssl_private_key_sign(SSL_HANDSHAKE *, uint8_t *, size_t *, size_t, uint16_t, Span<const uint8_t>)"
                 );
  }
  if (pSVar1 == (SSL_PRIVATE_KEY_METHOD *)0x0) {
    *out_len = max_out;
    internal::
    StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
    ::StackAllocatedMovable
              ((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                *)local_130);
    peVar12 = internal::
              StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
              ::get((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                     *)local_130);
    bVar3 = setup_ctx(ssl_00,peVar12,peVar9,sigalg,false);
    if (bVar3) {
      peVar12 = internal::
                StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                ::get((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                       *)local_130);
      puVar10 = Span<const_unsigned_char>::data(&in);
      sVar11 = Span<const_unsigned_char>::size(&in);
      iVar5 = EVP_DigestSign(peVar12,out,out_len,puVar10,sVar11);
      if (iVar5 == 0) goto LAB_001b76c8;
      local_a0 = 0;
    }
    else {
LAB_001b76c8:
      hs_local._4_4_ = ssl_private_key_failure;
      local_a0 = 1;
    }
    internal::
    StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
    ::~StackAllocatedMovable
              ((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                *)local_130);
    if (local_a0 != 0) goto LAB_001b7853;
  }
  else {
    if ((*(uint *)&hs->field_0x6c8 >> 0x12 & 1) == 0) {
      p_Var2 = pSVar1->sign;
      puVar10 = Span<const_unsigned_char>::data(&in);
      sVar11 = Span<const_unsigned_char>::size(&in);
      ctx.ctx_.pctx_ops._4_4_ = (*p_Var2)(ssl_00,out,out_len,max_out,sigalg,puVar10,sVar11);
    }
    else {
      ctx.ctx_.pctx_ops._4_4_ = (*pSVar1->complete)(ssl_00,out,out_len,max_out);
    }
    if (ctx.ctx_.pctx_ops._4_4_ == ssl_private_key_failure) {
      ERR_put_error(0x10,0,0x11f,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_privkey.cc"
                    ,0xef);
    }
    *(uint *)&hs->field_0x6c8 =
         *(uint *)&hs->field_0x6c8 & 0xfffbffff |
         (uint)(ctx.ctx_.pctx_ops._4_4_ == ssl_private_key_retry) << 0x12;
    if (ctx.ctx_.pctx_ops._4_4_ != ssl_private_key_success) {
      hs_local._4_4_ = ctx.ctx_.pctx_ops._4_4_;
      local_a0 = 1;
      goto LAB_001b7853;
    }
  }
  if ((pSVar7 != (pointer)0x0) && ((*(uint *)&hs->field_0x6c8 >> 0x14 & 1) != 0)) {
    pSVar7->signature_algorithm = sigalg;
    Array<unsigned_char>::operator=
              (&pSVar7->signature_spki,(Array<unsigned_char> *)((long)&spki_cbb.ctx_.u + 0x18));
    local_148 = in.data_;
    sStack_140 = in.size_;
    bVar3 = Array<unsigned_char>::CopyFrom(&pSVar7->signature_input,in);
    local_25e = 1;
    if (bVar3) {
      Span<unsigned_char>::Span(&local_168,out,*out_len);
      Span<unsigned_char_const>::Span<bssl::Span<unsigned_char>,void,bssl::Span<unsigned_char>>
                ((Span<unsigned_char_const> *)&local_158,&local_168);
      bVar3 = Array<unsigned_char>::CopyFrom(&pSVar7->signature,local_158);
      local_25e = bVar3 ^ 0xff;
    }
    if ((local_25e & 1) != 0) {
      hs_local._4_4_ = ssl_private_key_failure;
      local_a0 = 1;
      goto LAB_001b7853;
    }
  }
  hs_local._4_4_ = ssl_private_key_success;
  local_a0 = 1;
LAB_001b7853:
  Array<unsigned_char>::~Array((Array<unsigned_char> *)((long)&spki_cbb.ctx_.u + 0x18));
  return hs_local._4_4_;
}

Assistant:

enum ssl_private_key_result_t ssl_private_key_sign(
    SSL_HANDSHAKE *hs, uint8_t *out, size_t *out_len, size_t max_out,
    uint16_t sigalg, Span<const uint8_t> in) {
  SSL *const ssl = hs->ssl;
  const SSL_CREDENTIAL *const cred = hs->credential.get();
  SSL_HANDSHAKE_HINTS *const hints = hs->hints.get();
  Array<uint8_t> spki;
  if (hints) {
    ScopedCBB spki_cbb;
    if (!CBB_init(spki_cbb.get(), 64) ||
        !EVP_marshal_public_key(spki_cbb.get(), cred->pubkey.get()) ||
        !CBBFinishArray(spki_cbb.get(), &spki)) {
      ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_INTERNAL_ERROR);
      return ssl_private_key_failure;
    }
  }

  // Replay the signature from handshake hints if available.
  if (hints && !hs->hints_requested &&         //
      sigalg == hints->signature_algorithm &&  //
      in == hints->signature_input &&          //
      Span(spki) == hints->signature_spki &&   //
      !hints->signature.empty() &&             //
      hints->signature.size() <= max_out) {
    // Signature algorithm and input both match. Reuse the signature from hints.
    *out_len = hints->signature.size();
    OPENSSL_memcpy(out, hints->signature.data(), hints->signature.size());
    return ssl_private_key_success;
  }

  const SSL_PRIVATE_KEY_METHOD *key_method = cred->key_method;
  EVP_PKEY *privkey = cred->privkey.get();
  assert(!hs->can_release_private_key);

  if (key_method != NULL) {
    enum ssl_private_key_result_t ret;
    if (hs->pending_private_key_op) {
      ret = key_method->complete(ssl, out, out_len, max_out);
    } else {
      ret = key_method->sign(ssl, out, out_len, max_out, sigalg, in.data(),
                             in.size());
    }
    if (ret == ssl_private_key_failure) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_PRIVATE_KEY_OPERATION_FAILED);
    }
    hs->pending_private_key_op = ret == ssl_private_key_retry;
    if (ret != ssl_private_key_success) {
      return ret;
    }
  } else {
    *out_len = max_out;
    ScopedEVP_MD_CTX ctx;
    if (!setup_ctx(ssl, ctx.get(), privkey, sigalg, false /* sign */) ||
        !EVP_DigestSign(ctx.get(), out, out_len, in.data(), in.size())) {
      return ssl_private_key_failure;
    }
  }

  // Save the hint if applicable.
  if (hints && hs->hints_requested) {
    hints->signature_algorithm = sigalg;
    hints->signature_spki = std::move(spki);
    if (!hints->signature_input.CopyFrom(in) ||
        !hints->signature.CopyFrom(Span(out, *out_len))) {
      return ssl_private_key_failure;
    }
  }
  return ssl_private_key_success;
}